

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::DisplayStatus(cmMakefile *this,string *message,float s)

{
  WorkingMode WVar1;
  cmake *this_00;
  cmake *cm;
  float s_local;
  string *message_local;
  cmMakefile *this_local;
  
  this_00 = GetCMakeInstance(this);
  WVar1 = cmake::GetWorkingMode(this_00);
  if (WVar1 != FIND_PACKAGE_MODE) {
    cmake::UpdateProgress(this_00,message,s);
  }
  return;
}

Assistant:

void cmMakefile::DisplayStatus(const std::string& message, float s) const
{
  cmake* cm = this->GetCMakeInstance();
  if (cm->GetWorkingMode() == cmake::FIND_PACKAGE_MODE) {
    // don't output any STATUS message in FIND_PACKAGE_MODE, since they will
    // directly be fed to the compiler, which will be confused.
    return;
  }
  cm->UpdateProgress(message, s);
}